

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O0

errno_t wcscpy_s(WCHAR *_Dst,size_t _SizeInWords,WCHAR *_Src)

{
  WCHAR WVar1;
  bool bVar2;
  size_t local_38;
  size_t available;
  WCHAR *p;
  WCHAR *_Src_local;
  size_t _SizeInWords_local;
  WCHAR *_Dst_local;
  
  if ((_Dst == (WCHAR *)0x0) || (_SizeInWords == 0)) {
    _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
    _Dst_local._4_4_ = 0x16;
  }
  else {
    local_38 = _SizeInWords;
    available = (size_t)_Dst;
    p = _Src;
    if (_Src == (WCHAR *)0x0) {
      *_Dst = L'\0';
      if (1 < _SizeInWords) {
        memset(_Dst + 1,0xfd,(_SizeInWords - 1) * 2);
      }
      _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
      _Dst_local._4_4_ = 0x16;
    }
    else {
      do {
        WVar1 = *p;
        *(WCHAR *)available = WVar1;
        bVar2 = false;
        if (WVar1 != L'\0') {
          local_38 = local_38 - 1;
          bVar2 = local_38 != 0;
        }
        available = available + 2;
        p = p + 1;
      } while (bVar2);
      if (local_38 == 0) {
        *_Dst = L'\0';
        if (1 < _SizeInWords) {
          memset(_Dst + 1,0xfd,(_SizeInWords - 1) * 2);
        }
        _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
        _Dst_local._4_4_ = 0x22;
      }
      else {
        if ((_SizeInWords - local_38) + 1 < _SizeInWords) {
          memset(_Dst + (_SizeInWords - local_38) + 1,0xfd,(local_38 - 1) * 2);
        }
        _Dst_local._4_4_ = 0;
      }
    }
  }
  return _Dst_local._4_4_;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl wcscpy_s(WCHAR *_Dst, size_t _SizeInWords, const WCHAR *_Src)
{
    WCHAR *p;
    size_t available;

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInWords);
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInWords);

    p = _Dst;
    available = _SizeInWords;
    while ((*p++ = *_Src++) != 0 && --available > 0)
    {
    }

    if (available == 0)
    {
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInWords);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInWords, _SizeInWords - available + 1);
    return 0;
}